

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint ** Extra_TruthPerm63(void)

{
  uint **ppuVar1;
  uint **ppuVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uTruth [2];
  uint local_30;
  uint local_2c;
  
  ppuVar1 = (uint **)malloc(0x20800);
  *ppuVar1 = (uint *)(ppuVar1 + 0x100);
  ppuVar2 = ppuVar1 + 0x140;
  lVar3 = 1;
  do {
    ppuVar1[lVar3] = (uint *)ppuVar2;
    lVar3 = lVar3 + 1;
    ppuVar2 = ppuVar2 + 0x40;
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    local_30 = (int)lVar3 * 0x1010101;
    lVar4 = 0;
    lVar5 = 0;
    local_2c = local_30;
    do {
      Extra_TruthPerm6One(&local_30,(int)lVar5,(uint *)((long)ppuVar1[lVar3] + lVar4));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 != 0x40);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return ppuVar1;
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}